

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latex.hpp
# Opt level: O1

string * __thiscall
viennamath::rt_latex_translator<viennamath::rt_expression_interface<double>>::
process_impl_abi_cxx11_
          (string *__return_storage_ptr__,
          rt_latex_translator<viennamath::rt_expression_interface<double>> *this,
          rt_expression_interface<double> *ptr,bool use_parenthesis)

{
  ostream *poVar1;
  undefined8 *puVar2;
  string *psVar3;
  string ret;
  pointer local_78;
  size_type local_70;
  char local_68;
  undefined7 uStack_67;
  undefined8 uStack_60;
  string *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  local_78 = &local_68;
  local_70 = 0;
  local_68 = '\0';
  puVar2 = *(undefined8 **)this;
  local_58 = __return_storage_ptr__;
  if (puVar2 != *(undefined8 **)(this + 8)) {
    do {
      (**(code **)(*(long *)*puVar2 + 8))
                ((string *)local_50,(long *)*puVar2,ptr,use_parenthesis,this);
      std::__cxx11::string::operator=((string *)&local_78,(string *)local_50);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      if (local_70 != 0) {
        (local_58->_M_dataplus)._M_p = (pointer)&local_58->field_2;
        if (local_78 == &local_68) {
          (local_58->field_2)._M_allocated_capacity = CONCAT71(uStack_67,local_68);
          *(undefined8 *)((long)&local_58->field_2 + 8) = uStack_60;
        }
        else {
          (local_58->_M_dataplus)._M_p = local_78;
          (local_58->field_2)._M_allocated_capacity = CONCAT71(uStack_67,local_68);
        }
        local_58->_M_string_length = local_70;
        local_70 = 0;
        local_68 = '\0';
        psVar3 = local_58;
        local_78 = &local_68;
        goto LAB_0011c166;
      }
      puVar2 = puVar2 + 1;
    } while (puVar2 != *(undefined8 **)(this + 8));
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"ViennaMath: Warning: Unknown type in latex translator: ",0x37);
  poVar1 = std::ostream::_M_insert<void_const*>(&std::cerr);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  psVar3 = local_58;
  (local_58->_M_dataplus)._M_p = (pointer)&local_58->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_58," \\chi_{\\mathrm{unknown}} ","");
LAB_0011c166:
  if (local_78 != &local_68) {
    operator_delete(local_78,CONCAT71(uStack_67,local_68) + 1);
  }
  return psVar3;
}

Assistant:

std::string process_impl(InterfaceType const * ptr,
                               bool use_parenthesis = false) const
      {
        std::string ret;

        for (typename ProcessorArray::const_iterator it = processors_.begin();
                                                     it != processors_.end();
                                                   ++it)
        {
          ret = (*it)->process(ptr, use_parenthesis, *this);
          if (ret.size() > 0)
            return ret;
        }

        std::cerr << "ViennaMath: Warning: Unknown type in latex translator: " << ptr << std::endl;
        //throw "Unknown type!";
        return " \\chi_{\\mathrm{unknown}} ";
      }